

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O3

void __thiscall cmCTestCurl::SetProxyType(cmCTestCurl *this)

{
  string *psVar1;
  int iVar2;
  curl_proxytype cVar3;
  char *pcVar4;
  char *pcVar5;
  string type;
  allocator local_41;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar4 = cmsys::SystemTools::GetEnv("HTTP_PROXY");
  if (pcVar4 == (char *)0x0) {
    return;
  }
  pcVar5 = cmsys::SystemTools::GetEnv("HTTP_PROXY");
  psVar1 = &this->HTTPProxy;
  pcVar4 = (char *)(this->HTTPProxy)._M_string_length;
  strlen(pcVar5);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,(ulong)pcVar5);
  pcVar4 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PORT");
  if (pcVar4 != (char *)0x0) {
    std::__cxx11::string::append((char *)psVar1);
    cmsys::SystemTools::GetEnv("HTTP_PROXY_PORT");
    std::__cxx11::string::append((char *)psVar1);
  }
  pcVar4 = cmsys::SystemTools::GetEnv("HTTP_PROXY_TYPE");
  if (pcVar4 == (char *)0x0) goto LAB_002dcdfc;
  this->HTTPProxyType = CURLPROXY_HTTP;
  pcVar4 = cmsys::SystemTools::GetEnv("HTTP_PROXY_TYPE");
  std::__cxx11::string::string((string *)local_40,pcVar4,&local_41);
  iVar2 = std::__cxx11::string::compare((char *)local_40);
  if (iVar2 == 0) {
    cVar3 = CURLPROXY_HTTP;
LAB_002dcdde:
    this->HTTPProxyType = cVar3;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_40);
    if (iVar2 == 0) {
      cVar3 = CURLPROXY_SOCKS4;
      goto LAB_002dcdde;
    }
    iVar2 = std::__cxx11::string::compare((char *)local_40);
    if (iVar2 == 0) {
      cVar3 = CURLPROXY_SOCKS5;
      goto LAB_002dcdde;
    }
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
LAB_002dcdfc:
  pcVar4 = cmsys::SystemTools::GetEnv("HTTP_PROXY_USER");
  if (pcVar4 != (char *)0x0) {
    pcVar5 = cmsys::SystemTools::GetEnv("HTTP_PROXY_USER");
    pcVar4 = (char *)(this->HTTPProxyAuth)._M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&this->HTTPProxyAuth,0,pcVar4,(ulong)pcVar5);
  }
  pcVar4 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PASSWD");
  if (pcVar4 != (char *)0x0) {
    std::__cxx11::string::append((char *)&this->HTTPProxyAuth);
    cmsys::SystemTools::GetEnv("HTTP_PROXY_PASSWD");
    std::__cxx11::string::append((char *)&this->HTTPProxyAuth);
  }
  return;
}

Assistant:

void cmCTestCurl::SetProxyType()
{
  if ( cmSystemTools::GetEnv("HTTP_PROXY") )
    {
    this->HTTPProxy = cmSystemTools::GetEnv("HTTP_PROXY");
    if ( cmSystemTools::GetEnv("HTTP_PROXY_PORT") )
      {
      this->HTTPProxy += ":";
      this->HTTPProxy += cmSystemTools::GetEnv("HTTP_PROXY_PORT");
      }
    if ( cmSystemTools::GetEnv("HTTP_PROXY_TYPE") )
      {
      // this is the default
      this->HTTPProxyType = CURLPROXY_HTTP;
      std::string type = cmSystemTools::GetEnv("HTTP_PROXY_TYPE");
      // HTTP/SOCKS4/SOCKS5
      if ( type == "HTTP" )
        {
        this->HTTPProxyType = CURLPROXY_HTTP;
        }
      else if ( type == "SOCKS4" )
        {
        this->HTTPProxyType = CURLPROXY_SOCKS4;
        }
      else if ( type == "SOCKS5" )
        {
        this->HTTPProxyType = CURLPROXY_SOCKS5;
        }
      }
    if ( cmSystemTools::GetEnv("HTTP_PROXY_USER") )
      {
      this->HTTPProxyAuth = cmSystemTools::GetEnv("HTTP_PROXY_USER");
      }
    if ( cmSystemTools::GetEnv("HTTP_PROXY_PASSWD") )
      {
      this->HTTPProxyAuth += ":";
      this->HTTPProxyAuth += cmSystemTools::GetEnv("HTTP_PROXY_PASSWD");
      }
    }
}